

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_transform_kernel_sse
               (Mat *kernel,Mat *kernel_tm2,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  int *piVar14;
  undefined1 auVar15 [32];
  char cVar16;
  int iVar17;
  long lVar18;
  undefined4 *puVar19;
  ulong uVar20;
  void *pvVar21;
  ulong uVar22;
  ulong uVar23;
  undefined4 *puVar24;
  void *pvVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  undefined8 *puVar29;
  long lVar30;
  ulong uVar31;
  void *pvVar32;
  undefined4 *puVar33;
  int j;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float tmp [4] [3];
  Mat local_b8;
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  
  uVar31 = (ulong)(uint)outch;
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Mat::create(&local_b8,0x10,inch,outch,4,(Allocator *)0x0);
  auVar15 = _DAT_00518680;
  uVar20 = (ulong)(uint)inch;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar23 = 0;
    pvVar32 = local_b8.data;
    do {
      if (0 < inch) {
        iVar17 = inch * 9 * (int)uVar23;
        uVar27 = 0;
        pvVar21 = pvVar32;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar27 * 0x24 + (long)iVar17 * 4 + 0x20);
          auVar35._0_4_ = fVar2 * 0.0 + fVar1 * 1.0 + fVar3 * 0.0;
          auVar35._4_4_ = fVar2 * 0.5 + fVar1 * 0.5 + fVar3 * 0.5;
          auVar35._8_4_ = fVar2 * -0.5 + fVar1 * 0.5 + fVar3 * 0.5;
          auVar35._12_4_ = fVar2 * 0.0 + fVar1 * 0.0 + fVar3 * 1.0;
          auVar36._0_4_ = fVar5 * 0.0 + fVar4 * 1.0 + fVar6 * 0.0;
          auVar36._4_4_ = fVar5 * 0.5 + fVar4 * 0.5 + fVar6 * 0.5;
          auVar36._8_4_ = fVar5 * -0.5 + fVar4 * 0.5 + fVar6 * 0.5;
          auVar36._12_4_ = fVar5 * 0.0 + fVar4 * 0.0 + fVar6 * 1.0;
          auVar37._0_8_ =
               CONCAT44(fVar8 * 0.5 + fVar7 * 0.5 + fVar9 * 0.5,
                        fVar8 * 0.0 + fVar7 * 1.0 + fVar9 * 0.0);
          auVar37._8_4_ = fVar8 * -0.5 + fVar7 * 0.5 + fVar9 * 0.5;
          auVar37._12_4_ = fVar8 * 0.0 + fVar7 * 0.0 + fVar9 * 1.0;
          auVar39._16_16_ = auVar36;
          auVar39._0_16_ = auVar35;
          auVar41 = vpermilps_avx(auVar39,auVar15);
          auVar40._16_16_ = auVar35;
          auVar40._0_16_ = auVar36;
          auVar39 = vmovsldup_avx(auVar40);
          auVar39 = vblendps_avx(auVar41,auVar39,0x42);
          auVar41._8_8_ = auVar37._0_8_;
          auVar41._0_8_ = auVar37._0_8_;
          auVar41._16_16_ = auVar37;
          local_68 = vblendps_avx(auVar39,auVar41,0x24);
          auVar36 = vshufps_avx(auVar35,auVar36,0xff);
          auVar35 = vshufpd_avx(auVar37,auVar37,3);
          local_48 = vblendps_avx(auVar35,auVar36,6);
          lVar34 = 0;
          pvVar25 = pvVar21;
          do {
            fVar1 = *(float *)(local_68 + lVar34 * 0xc);
            uVar10 = *(undefined8 *)(local_68 + lVar34 * 0xc + 4);
            puVar29 = &DAT_005188b4;
            lVar18 = 0;
            do {
              auVar38._0_4_ = (float)*puVar29 * (float)uVar10;
              auVar38._4_4_ = (float)((ulong)*puVar29 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar38._8_8_ = 0;
              auVar35 = vmovshdup_avx(auVar38);
              *(float *)((long)pvVar25 + lVar18 * 4) =
                   auVar38._0_4_ + fVar1 * *(float *)((long)puVar29 + -4) + auVar35._0_4_;
              lVar18 = lVar18 + 1;
              puVar29 = (undefined8 *)((long)puVar29 + 0xc);
            } while (lVar18 != 4);
            lVar34 = lVar34 + 1;
            pvVar25 = (void *)((long)pvVar25 + 0x10);
          } while (lVar34 != 4);
          uVar27 = uVar27 + 1;
          pvVar21 = (void *)((long)pvVar21 +
                            (long)local_b8.w *
                            CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        } while (uVar27 != uVar20);
      }
      uVar23 = uVar23 + 1;
      pvVar32 = (void *)((long)pvVar32 +
                        local_b8.cstep *
                        CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
    } while (uVar23 != uVar31);
  }
  uVar26 = outch + 3;
  iVar17 = outch + 7;
  if (-1 < outch) {
    uVar26 = outch;
    iVar17 = outch;
  }
  cVar16 = (char)outch - ((byte)iVar17 & 0xf8);
  uVar23 = 0;
  Mat::create(kernel_tm2,inch * 8,0x10,
              (outch - (uVar26 & 0xfffffffc)) + (iVar17 >> 3) +
              (int)((char)(((byte)(cVar16 >> 7) >> 6) + cVar16) >> 2),4,(Allocator *)0x0);
  if (7 < outch) {
    iVar17 = kernel_tm2->w;
    pvVar11 = kernel_tm2->data;
    sVar12 = kernel_tm2->elemsize;
    sVar13 = kernel_tm2->cstep;
    uVar27 = 0;
    do {
      lVar34 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      puVar19 = (undefined4 *)(lVar34 * uVar27 + (long)local_b8.data);
      lVar18 = 0;
      do {
        if (0 < inch) {
          lVar28 = (long)pvVar11 + (long)iVar17 * sVar12 * lVar18 + (uVar27 >> 3) * sVar13 * sVar12;
          uVar23 = 0;
          puVar24 = puVar19;
          do {
            lVar30 = 0;
            puVar33 = puVar24;
            do {
              *(undefined4 *)(lVar28 + lVar30) = *puVar33;
              puVar33 = (undefined4 *)((long)puVar33 + lVar34);
              lVar30 = lVar30 + 4;
            } while (lVar30 != 0x20);
            uVar23 = uVar23 + 1;
            puVar24 = (undefined4 *)
                      ((long)puVar24 +
                      (long)local_b8.w *
                      CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
            lVar28 = lVar28 + 0x20;
          } while (uVar23 != uVar20);
        }
        lVar18 = lVar18 + 1;
        puVar19 = puVar19 + 1;
      } while (lVar18 != 0x10);
      uVar23 = uVar27 + 8;
      uVar22 = uVar27 + 0xf;
      uVar27 = uVar23;
    } while (uVar22 < uVar31);
  }
  if ((int)((uint)uVar23 | 3) < outch) {
    iVar17 = kernel_tm2->w;
    pvVar11 = kernel_tm2->data;
    sVar12 = kernel_tm2->elemsize;
    sVar13 = kernel_tm2->cstep;
    uVar23 = uVar23 & 0xffffffff;
    do {
      lVar34 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      puVar19 = (undefined4 *)(lVar34 * uVar23 + (long)local_b8.data);
      lVar18 = 0;
      do {
        if (0 < inch) {
          lVar28 = (long)pvVar11 +
                   (long)iVar17 * sVar12 * lVar18 +
                   (ulong)(((uint)(uVar23 >> 3) & 0x1fffffff) + (uint)(((uint)uVar23 >> 2 & 1) != 0)
                          ) * sVar13 * sVar12;
          uVar27 = 0;
          puVar24 = puVar19;
          do {
            lVar30 = 0;
            puVar33 = puVar24;
            do {
              *(undefined4 *)(lVar28 + lVar30) = *puVar33;
              puVar33 = (undefined4 *)((long)puVar33 + lVar34);
              lVar30 = lVar30 + 4;
            } while (lVar30 != 0x10);
            uVar27 = uVar27 + 1;
            puVar24 = (undefined4 *)
                      ((long)puVar24 +
                      (long)local_b8.w *
                      CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
            lVar28 = lVar28 + 0x10;
          } while (uVar27 != uVar20);
        }
        lVar18 = lVar18 + 1;
        puVar19 = puVar19 + 1;
      } while (lVar18 != 0x10);
      uVar23 = uVar23 + 4;
    } while ((int)((uint)uVar23 | 3) < outch);
  }
  if ((int)uVar23 < outch) {
    iVar17 = kernel_tm2->w;
    pvVar11 = kernel_tm2->data;
    sVar12 = kernel_tm2->elemsize;
    uVar27 = uVar23 & 0xffffffff;
    sVar13 = kernel_tm2->cstep;
    do {
      uVar26 = (uint)uVar23;
      pvVar32 = (void *)((ulong)((uVar26 & 3) + ((uint)(uVar23 >> 3) & 0x1fffffff) +
                                (uint)((uVar26 >> 2 & 1) != 0)) * sVar13 * sVar12 + (long)pvVar11);
      puVar19 = (undefined4 *)
                (CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) * local_b8.cstep *
                 uVar27 + (long)local_b8.data);
      lVar34 = 0;
      do {
        if (0 < inch) {
          uVar23 = 0;
          puVar24 = puVar19;
          do {
            *(undefined4 *)((long)pvVar32 + uVar23 * 4) = *puVar24;
            uVar23 = uVar23 + 1;
            puVar24 = (undefined4 *)
                      ((long)puVar24 +
                      (long)local_b8.w *
                      CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
          } while (uVar20 != uVar23);
        }
        lVar34 = lVar34 + 1;
        puVar19 = puVar19 + 1;
        pvVar32 = (void *)((long)pvVar32 + (long)iVar17 * sVar12);
      } while (lVar34 != 0x10);
      uVar27 = uVar27 + 1;
      uVar23 = (ulong)(uVar26 + 1);
    } while (uVar27 != uVar31);
  }
  piVar14 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm2, int inch, int outch, const Option& opt)
{
    Mat kernel_tm(4 * 4, inch, outch);

    // G
    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 16-inch-outch
    // dst = inch-16-outch
#if __SSE2__
    kernel_tm2.create(8 * inch, 16, outch / 8 + (outch % 8) / 4 + outch % 4);
#else
    kernel_tm2.create(inch, 16, outch);
#endif

    int q = 0;
#if __SSE2__
    for (; q + 7 < outch; q += 8)
    {
        Mat g0 = kernel_tm2.channel(q / 8);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 8; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
#endif
    for (; q < outch; q++)
    {
#if __SSE2__
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4 + q % 4);
#else
        Mat g0 = kernel_tm2.channel(q);
#endif

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                const float* k00 = kernel_tm.channel(q).row(p);
                g00[0] = k00[k];
                g00++;
            }
        }
    }
}